

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

void * crn_decompress_crn_to_dds(void *pCRN_file_data,crn_uint32 *file_size)

{
  bool bVar1;
  crn_uint32 cVar2;
  uchar *puVar3;
  dynamic_stream dds_file_data;
  data_stream_serializer serializer;
  mipmapped_texture tex;
  dynamic_stream dStack_a8;
  data_stream_serializer local_70;
  mipmapped_texture local_60;
  
  crnlib::mipmapped_texture::mipmapped_texture(&local_60);
  bVar1 = crnlib::mipmapped_texture::read_crn_from_memory
                    (&local_60,pCRN_file_data,*file_size,"from_memory.crn");
  *file_size = 0;
  if (bVar1) {
    crnlib::dynamic_stream::dynamic_stream(&dStack_a8);
    if ((dStack_a8.super_data_stream._26_1_ & 1) != 0) {
      crnlib::vector<unsigned_char>::reserve(&dStack_a8.m_buf,0x20000);
    }
    local_70.m_little_endian = true;
    local_70.m_pStream = &dStack_a8.super_data_stream;
    bVar1 = crnlib::mipmapped_texture::write_dds(&local_60,&local_70);
    if (bVar1) {
      if ((dStack_a8.super_data_stream._26_1_ & 1) != 0) {
        crnlib::vector<unsigned_char>::reserve(&dStack_a8.m_buf,0);
      }
      puVar3 = dStack_a8.m_buf.m_p;
      cVar2 = 0;
      if ((dStack_a8.super_data_stream._26_1_ & 1) != 0) {
        cVar2 = dStack_a8.m_buf.m_size;
      }
      *file_size = cVar2;
      dStack_a8.m_buf.m_p = (uchar *)0x0;
      dStack_a8.m_buf.m_size = 0;
      dStack_a8.m_buf.m_capacity = 0;
    }
    else {
      puVar3 = (uchar *)0x0;
    }
    crnlib::dynamic_stream::~dynamic_stream(&dStack_a8);
  }
  else {
    puVar3 = (uchar *)0x0;
  }
  crnlib::mipmapped_texture::~mipmapped_texture(&local_60);
  return puVar3;
}

Assistant:

void* crn_decompress_crn_to_dds(const void* pCRN_file_data, crn_uint32& file_size) {
  mipmapped_texture tex;
  if (!tex.read_crn_from_memory(pCRN_file_data, file_size, "from_memory.crn")) {
    file_size = 0;
    return NULL;
  }

  file_size = 0;

  dynamic_stream dds_file_data;
  dds_file_data.reserve(128 * 1024);
  data_stream_serializer serializer(dds_file_data);
  if (!tex.write_dds(serializer))
    return NULL;
  dds_file_data.reserve(0);

  file_size = static_cast<crn_uint32>(dds_file_data.get_size());
  return dds_file_data.get_buf().assume_ownership();
}